

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

bool QMetaType::
     registerConverter<QList<QSize>,QIterable<QMetaSequence>,QtPrivate::QSequentialIterableConvertFunctor<QList<QSize>>>
               (void)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  anon_class_1_1_3a3b9956 converter;
  QMetaType toType;
  QMetaType fromType;
  anon_class_1_1_3a3b9956 *__f;
  function<bool_(const_void_*,_void_*)> *this;
  QMetaType in_stack_ffffffffffffffd0;
  QMetaType in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __f = (anon_class_1_1_3a3b9956 *)&DAT_aaaaaaaaaaaaaaaa;
  fromType<QList<QSize>>();
  fromType<QIterable<QMetaSequence>>();
  this = (function<bool_(const_void_*,_void_*)> *)&stack0xffffffffffffffc0;
  std::function<bool(void_const*,void*)>::
  function<QMetaType::registerConverter<QList<QSize>,QIterable<QMetaSequence>,QtPrivate::QSequentialIterableConvertFunctor<QList<QSize>>>(QtPrivate::QSequentialIterableConvertFunctor<QList<QSize>>)::_lambda(void_const*,void*)_1_,void>
            (this,__f);
  bVar2 = registerConverterImpl<QList<QSize>,QIterable<QMetaSequence>>
                    (this,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::function<bool_(const_void_*,_void_*)>::~function
            ((function<bool_(const_void_*,_void_*)> *)0x27c948);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool registerConverter(UnaryFunction function)
    {
        static_assert((!QMetaTypeId2<To>::IsBuiltIn || !QMetaTypeId2<From>::IsBuiltIn),
            "QMetaType::registerConverter: At least one of the types must be a custom type.");

        const QMetaType fromType = QMetaType::fromType<From>();
        const QMetaType toType = QMetaType::fromType<To>();
        auto converter = [function = std::move(function)](const void *from, void *to) -> bool {
            const From *f = static_cast<const From *>(from);
            To *t = static_cast<To *>(to);
            auto &&r = function(*f);
            if constexpr (std::is_same_v<q20::remove_cvref_t<decltype(r)>, std::optional<To>>) {
                if (!r)
                    return false;
                *t = *std::forward<decltype(r)>(r);
            } else {
                *t = std::forward<decltype(r)>(r);
            }
            return true;
        };
        return registerConverterImpl<From, To>(std::move(converter), fromType, toType);
    }